

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

int __thiscall QtMWidgets::SliderPrivate::pixelPosToRangeValue(SliderPrivate *this,int p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_2c;
  int local_28;
  int sliderMax;
  int sliderMin;
  QRect gr;
  int p_local;
  SliderPrivate *this_local;
  
  gr.x2 = p;
  unique0x10000102 = this;
  _sliderMax = grooveRect(this);
  iVar2 = QAbstractSlider::orientation();
  if (iVar2 == 1) {
    local_28 = QRect::x((QRect *)&sliderMax);
    local_2c = QRect::right((QRect *)&sliderMax);
    local_2c = local_2c + this->radius * -2;
  }
  else {
    local_28 = QRect::y((QRect *)&sliderMax);
    local_2c = QRect::bottom((QRect *)&sliderMax);
    local_2c = local_2c + this->radius * -2;
  }
  iVar2 = QAbstractSlider::minimum();
  iVar3 = QAbstractSlider::maximum();
  iVar4 = gr.x2 - local_28;
  bVar1 = QAbstractSlider::invertedAppearance();
  iVar2 = QStyle::sliderValueFromPosition(iVar2,iVar3,iVar4,local_2c - local_28,(bool)(bVar1 & 1));
  return iVar2;
}

Assistant:

int
SliderPrivate::pixelPosToRangeValue( int p ) const
{
	const QRect gr = grooveRect();

	int sliderMin = 0, sliderMax = 0;

	if( q->orientation() == Qt::Horizontal )
	{
		sliderMin = gr.x();
		sliderMax = gr.right() - 2 * radius;
	}
	else
	{
		sliderMin = gr.y();
		sliderMax = gr.bottom() - 2 * radius;
	}

	return QStyle::sliderValueFromPosition( q->minimum(), q->maximum(),
		p - sliderMin, sliderMax - sliderMin, q->invertedAppearance() );
}